

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O0

vm_obj_id_t __thiscall find_ctx::results_to_list(find_ctx *this)

{
  bool bVar1;
  CVmObjList *in_RDI;
  vm_val_t ele;
  int pg_idx;
  find_entry *ep;
  int idx;
  find_entry_page *pg;
  CVmObjList *lst;
  vm_obj_id_t lst_id;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  undefined1 uVar2;
  vm_val_t local_48;
  int local_34;
  _func_int **local_30;
  int local_24;
  _func_int **local_20;
  CVmObject *local_18;
  vm_obj_id_t local_c;
  
  local_c = CVmObjList::create((int)((ulong)in_RDI >> 0x20),
                               CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  local_18 = vm_objp(0);
  local_24 = 0;
  local_20 = (in_RDI->super_CVmObjCollection).super_CVmObject._vptr_CVmObject;
  while (local_24 <
         *(int *)((long)&in_RDI[1].super_CVmObjCollection.super_CVmObject._vptr_CVmObject + 4)) {
    local_30 = local_20 + 1;
    local_34 = 0;
    for (; bVar1 = local_24 <
                   *(int *)((long)&in_RDI[1].super_CVmObjCollection.super_CVmObject._vptr_CVmObject
                           + 4), uVar2 = bVar1 && local_34 < 0x20, bVar1 && local_34 < 0x20;
        local_24 = local_24 + 1) {
      vm_val_t::set_obj(&local_48,*(vm_obj_id_t *)local_30);
      CVmObjList::cons_set_element
                (in_RDI,CONCAT17(uVar2,in_stack_ffffffffffffffa8),(vm_val_t *)0x32bbd7);
      CVmObjList::cons_set_element
                (in_RDI,CONCAT17(uVar2,in_stack_ffffffffffffffa8),(vm_val_t *)0x32bbf6);
      local_34 = local_34 + 1;
      local_30 = local_30 + 3;
    }
    local_20 = (_func_int **)*local_20;
  }
  return local_c;
}

Assistant:

vm_obj_id_t results_to_list(VMG0_)
    {
        vm_obj_id_t lst_id;
        CVmObjList *lst;
        find_entry_page *pg;
        int idx;
        
        /* 
         *   Allocate a list of the appropriate size.  We need two list
         *   entries per result, since we need to store the object and the
         *   match result code for each result.  
         */
        lst_id = CVmObjList::create(vmg_ FALSE, result_cnt * 2);
        lst = (CVmObjList *)vm_objp(vmg_ lst_id);

        /* add all entries */
        for (idx = 0, pg = results_head ; idx < result_cnt ; pg = pg->nxt)
        {
            find_entry *ep;
            int pg_idx;
            
            /* add each entry on this page */
            for (ep = pg->entry, pg_idx = 0 ;
                 idx < result_cnt && pg_idx < FIND_ENTRIES_PER_PAGE ;
                 ++idx, ++pg_idx, ++ep)
            {
                vm_val_t ele;
                    
                /* add this entry to the list */
                ele.set_obj(ep->obj);
                lst->cons_set_element(idx*2, &ele);
                lst->cons_set_element(idx*2 + 1, &ep->match_result);
            }
        }

        /* return the list */
        return lst_id;
    }